

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v6::internal::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint64_t uVar11;
  char cVar12;
  int iVar13;
  result rVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  long lVar18;
  size_t __len;
  ulong uVar19;
  size_t new_size;
  uint64_t uVar20;
  ulong uVar21;
  ulong uVar22;
  uint64_t divisor;
  boundaries bVar23;
  fp fVar24;
  fp fVar25;
  ulong uStackY_b0;
  int local_90;
  int cached_exp10;
  uint64_t local_88;
  fp local_80;
  buffer<char> *local_70;
  ulong local_68;
  fixed_handler handler;
  
  uVar21 = (ulong)specs & 0xff00000000;
  if (value <= (longdouble)0) {
    if (0 < precision && uVar21 == 0x200000000) {
      buffer<char>::resize(buf,(ulong)(uint)precision);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  if ((specs._4_4_ >> 0x14 & 1) == 0) {
    iVar13 = snprintf_float<long_double>(value,precision,specs,buf);
    return iVar13;
  }
  local_90 = 0;
  cached_exp10 = 0;
  if (precision < 0) {
    local_80.f = 0;
    local_80.e = 0;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      bVar23 = fp::assign_with_boundaries<long_double>(&local_80,value);
    }
    else {
      bVar23 = fp::assign_float_with_boundaries<long_double>(&local_80,value);
    }
    fVar25._8_8_ = bVar23.upper;
    fVar25.f = (ulong)(uint)local_80.e;
    fVar24 = normalize<0>((internal *)local_80.f,fVar25);
    local_80.f = fVar24.f;
    local_80.e = fVar24.e;
    fVar24 = get_cached_power(-0x7c - local_80.e,&cached_exp10);
    uVar21 = fVar24.f;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar21;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_80.f;
    local_80.f = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
    cVar12 = (char)fVar24.e + (char)local_80.e;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar21;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar23.lower;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar21;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = fVar25._8_8_;
    lVar18 = SUB168(auVar5 * auVar9,8);
    lVar17 = -(SUB168(auVar5 * auVar9,0) >> 0x3f);
    uVar21 = lVar18 + lVar17 + 1;
    handler.buf = buf->ptr_;
    handler.size = 0;
    handler._16_8_ = uVar21 - local_80.f;
    bVar15 = -cVar12 - 0x40;
    bVar16 = -cVar12;
    divisor = 1L << (bVar16 & 0x3f);
    uVar20 = ((SUB168(auVar4 * auVar8,0) >> 0x3f) - SUB168(auVar4 * auVar8,8)) + lVar18 + lVar17 + 2
    ;
    local_88 = divisor - 1;
    uVar19 = local_88 & uVar21;
    uVar21 = uVar21 >> (bVar16 & 0x3f);
    local_80.e = fVar24.e + local_80.e + 0x40;
    local_70 = buf;
    local_90 = grisu_count_digits((uint32_t)uVar21);
    do {
      iVar13 = local_90 + -1;
      switch(iVar13) {
      case 0:
        cVar12 = (char)uVar21;
        uVar21 = 0;
        goto LAB_001594ba;
      case 1:
        uStackY_b0 = 10;
        break;
      case 2:
        uStackY_b0 = 100;
        break;
      case 3:
        uStackY_b0 = 1000;
        break;
      case 4:
        uStackY_b0 = 10000;
        break;
      case 5:
        uStackY_b0 = 100000;
        break;
      case 6:
        uStackY_b0 = 1000000;
        break;
      case 7:
        uStackY_b0 = 10000000;
        break;
      case 8:
        uStackY_b0 = 100000000;
        break;
      case 9:
        uStackY_b0 = 1000000000;
        break;
      default:
        cVar12 = '\0';
        goto LAB_001594ba;
      }
      cVar12 = (char)((uVar21 & 0xffffffff) / uStackY_b0);
      uVar21 = (uVar21 & 0xffffffff) % uStackY_b0;
LAB_001594ba:
      lVar17 = (long)local_90;
      local_90 = iVar13;
      rVar14 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,cVar12 + '0',
                          *(long *)(
                                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                   + lVar17 * 8 + 0x18) << (bVar15 & 0x3f),
                          ((uVar21 & 0xffffffff) << (bVar15 & 0x3f)) + uVar19,uVar20,iVar13,true);
      uVar11 = local_88;
      if (rVar14 != more) goto LAB_00159555;
    } while (0 < local_90);
    do {
      uVar21 = uVar19 * 10;
      uVar20 = uVar20 * 10;
      uVar19 = uVar21 & uVar11;
      local_90 = local_90 + -1;
      rVar14 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,(char)(uVar21 >> (bVar15 & 0x3f)) + '0'
                          ,divisor,uVar19,uVar20,local_90,false);
    } while (rVar14 == more);
LAB_00159555:
    new_size = (size_t)(uint)handler.size;
    if (rVar14 == error) {
      local_90 = local_90 + ~cached_exp10 + handler.size;
      fallback_format<long_double>(value,local_70,&local_90);
      return local_90;
    }
LAB_001595d5:
    buffer<char>::resize(local_70,new_size);
    local_90 = local_90 - cached_exp10;
  }
  else {
    if ((uint)precision < 0x12) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = buf;
      fVar24 = normalize<0>((internal *)0x0,(fp)(auVar10 << 0x40));
      local_88 = CONCAT44(local_88._4_4_,fVar24.e);
      local_70 = buf;
      fVar25 = get_cached_power(-0x7c - fVar24.e,&cached_exp10);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar25.f;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = fVar24.f;
      uVar22 = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
      local_88._0_4_ = fVar25.e + (int)local_88;
      handler.buf = local_70->ptr_;
      handler.size = 0;
      handler.fixed = uVar21 == 0x200000000;
      handler.exp10 = -cached_exp10;
      local_68 = CONCAT44(local_68._4_4_,(int)local_88);
      bVar15 = -(char)(int)local_88;
      local_88 = 1L << (bVar15 & 0x3f);
      uVar19 = uVar22 >> (bVar15 & 0x3f);
      handler.precision = precision;
      local_90 = grisu_count_digits((uint32_t)uVar19);
      rVar14 = fixed_handler::on_start
                         (&handler,*(long *)(
                                            "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                            + (long)local_90 * 8 + 0x18) << (bVar15 & 0x3f),
                          uVar22 / 10,10,&local_90);
      if (rVar14 == more) {
        bVar15 = -(char)local_68 - 0x40;
        local_68 = local_88 - 1;
        uVar22 = uVar22 & local_68;
        uVar20 = 1;
        do {
          iVar13 = local_90 + -1;
          switch(iVar13) {
          case 0:
            cVar12 = (char)uVar19;
            uVar19 = 0;
            goto LAB_0015928e;
          case 1:
            uStackY_b0 = 10;
            break;
          case 2:
            uStackY_b0 = 100;
            break;
          case 3:
            uStackY_b0 = 1000;
            break;
          case 4:
            uStackY_b0 = 10000;
            break;
          case 5:
            uStackY_b0 = 100000;
            break;
          case 6:
            uStackY_b0 = 1000000;
            break;
          case 7:
            uStackY_b0 = 10000000;
            break;
          case 8:
            uStackY_b0 = 100000000;
            break;
          case 9:
            uStackY_b0 = 1000000000;
            break;
          default:
            cVar12 = '\0';
            goto LAB_0015928e;
          }
          cVar12 = (char)((uVar19 & 0xffffffff) / uStackY_b0);
          uVar19 = (uVar19 & 0xffffffff) % uStackY_b0;
LAB_0015928e:
          lVar17 = (long)local_90;
          local_90 = iVar13;
          rVar14 = fixed_handler::on_digit
                             (&handler,cVar12 + '0',
                              *(long *)(
                                       "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                       + lVar17 * 8 + 0x18) << (bVar15 & 0x3f),
                              ((uVar19 & 0xffffffff) << (bVar15 & 0x3f)) + uVar22,1,iVar13,true);
          if (rVar14 != more) goto LAB_00159333;
        } while (0 < local_90);
        do {
          uVar19 = uVar22 * 10;
          uVar20 = uVar20 * 10;
          uVar22 = uVar19 & local_68;
          local_90 = local_90 + -1;
          rVar14 = fixed_handler::on_digit
                             (&handler,(char)(uVar19 >> (bVar15 & 0x3f)) + '0',local_88,uVar22,
                              uVar20,local_90,false);
        } while (rVar14 == more);
      }
LAB_00159333:
      buf = local_70;
      if (rVar14 != error) {
        uVar19 = (ulong)(uint)handler.size;
        if (0 < handler.size && uVar21 != 0x200000000) {
          uVar19 = (ulong)(uint)handler.size;
          do {
            iVar13 = local_90 + 1;
            if (local_70->ptr_[uVar19 - 1] != '0') goto LAB_001595d0;
            bVar1 = 1 < uVar19;
            uVar19 = uVar19 - 1;
            local_90 = iVar13;
          } while (bVar1);
          uVar19 = 0;
        }
LAB_001595d0:
        new_size = uVar19 & 0xffffffff;
        goto LAB_001595d5;
      }
    }
    local_90 = snprintf_float<long_double>(value,precision,specs,buf);
  }
  return local_90;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}